

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::FieldDescriptor::PrintableNameForExtension_abi_cxx11_(FieldDescriptor *this)

{
  Descriptor *pDVar1;
  Type TVar2;
  Descriptor *pDVar3;
  
  if ((this[0x42] == (FieldDescriptor)0x1) &&
     (*(char *)(*(long *)(*(long *)(this + 0x50) + 0x20) + 0x48) == '\x01')) {
    TVar2 = type(this);
    if ((TVar2 == TYPE_MESSAGE) && (*(int *)(this + 0x3c) == 1)) {
      pDVar1 = *(Descriptor **)(this + 0x60);
      pDVar3 = message_type(this);
      if (pDVar1 == pDVar3) {
        this = (FieldDescriptor *)message_type(this);
      }
    }
  }
  return *(string **)((Descriptor *)this + 8);
}

Assistant:

const std::string& FieldDescriptor::PrintableNameForExtension() const {
  const bool is_message_set_extension =
      is_extension() &&
      containing_type()->options().message_set_wire_format() &&
      type() == FieldDescriptor::TYPE_MESSAGE && is_optional() &&
      extension_scope() == message_type();
  return is_message_set_extension ? message_type()->full_name() : full_name();
}